

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtRuntime.cpp
# Opt level: O2

void JsrtRuntime::Uninitialize(void)

{
  JsrtRuntime *this;
  Type pTVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ThreadContext *threadContext;
  
  threadContext = ThreadContext::globalListFirst;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    if (threadContext == (ThreadContext *)0x0) {
      return;
    }
    if (threadContext->isScriptActive == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtRuntime.cpp"
                         ,0x3f,"(!currentThreadContext->IsScriptActive())",
                         "!currentThreadContext->IsScriptActive()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    this = (JsrtRuntime *)threadContext->jsrtRuntime;
    pTVar1 = (threadContext->super_DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>).
             next;
    CloseContexts(this);
    RentalThreadContextManager::DestroyThreadContext(threadContext);
    Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,JsrtRuntime>
              (&Memory::HeapAllocator::Instance,this);
    threadContext = pTVar1;
  } while( true );
}

Assistant:

void JsrtRuntime::Uninitialize()
{
    ThreadContext* currentThreadContext = ThreadContext::GetThreadContextList();
    ThreadContext* tmpThreadContext;
    while (currentThreadContext)
    {
        Assert(!currentThreadContext->IsScriptActive());
        JsrtRuntime* currentRuntime = static_cast<JsrtRuntime*>(currentThreadContext->GetJSRTRuntime());
        tmpThreadContext = currentThreadContext;
        currentThreadContext = currentThreadContext->Next();

#ifdef CHAKRA_STATIC_LIBRARY
        // xplat-todo: Cleanup staticlib shutdown. This only shuts down threads.
        // Other closing contexts / finalizers having trouble with current
        // runtime/context.
        RentalThreadContextManager::DestroyThreadContext(tmpThreadContext);
#else
        currentRuntime->CloseContexts();
        RentalThreadContextManager::DestroyThreadContext(tmpThreadContext);
        HeapDelete(currentRuntime);
#endif
    }
}